

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O2

int If_ManImproveNodeFaninCompact0
              (If_Man_t *p,If_Obj_t *pObj,int nLimit,Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited)

{
  int iVar1;
  If_Obj_t *pObj_00;
  int i;
  If_Man_t *p_00;
  
  i = 0;
  while( true ) {
    if (vFront->nSize <= i) {
      return 0;
    }
    p_00 = (If_Man_t *)vFront;
    pObj_00 = (If_Obj_t *)Vec_PtrEntry(vFront,i);
    if (((((undefined1  [112])*pObj_00 & (undefined1  [112])0xf) != (undefined1  [112])0x2) &&
        (iVar1 = If_ManImproveNodeWillGrow(p_00,pObj_00), iVar1 == 0)) &&
       (iVar1 = If_ManImproveNodeFaninCost(p_00,pObj_00), iVar1 < 1)) break;
    i = i + 1;
  }
  If_ManImproveNodeFaninUpdate(p_00,pObj_00,vFront,vVisited);
  return 1;
}

Assistant:

int If_ManImproveNodeFaninCompact0( If_Man_t * p, If_Obj_t * pObj, int nLimit, Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited )
{
    If_Obj_t * pFanin;
    int i;
    Vec_PtrForEachEntry( If_Obj_t *, vFront, pFanin, i )
    {
        if ( If_ObjIsCi(pFanin) )
            continue;
        if ( If_ManImproveNodeWillGrow(p, pFanin) )
            continue;
        if ( If_ManImproveNodeFaninCost(p, pFanin) <= 0 )
        {
            If_ManImproveNodeFaninUpdate( p, pFanin, vFront, vVisited );
            return 1;
        }
    }
    return 0;
}